

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

bool __thiscall ON_SurfaceDraftAngleColorMapping::IsSet(ON_SurfaceDraftAngleColorMapping *this)

{
  bool bVar1;
  
  bVar1 = true;
  if (this->m_is_set != '\x01') {
    if (this->m_is_set != '\0') {
      bVar1 = ON_3dVector::IsValid(&this->m_up);
      if (((bVar1) && (bVar1 = ON_Interval::IsValid(&this->m_angle_range_in_radians), bVar1)) &&
         (bVar1 = ON_Interval::IsValid(&this->m_hue_range_in_radians), bVar1)) {
        this->m_is_set = '\x01';
        return true;
      }
      this->m_is_set = '\0';
    }
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ON_SurfaceDraftAngleColorMapping::IsSet() const
{
  if (1 == this->m_is_set)
    return true;
  if (0 == this->m_is_set)
    return false;
  for (;;)
  {
    if (false == this->m_up.IsValid())
      break;
    if (false == this->m_angle_range_in_radians.IsValid())
      break;
    if (false == this->m_hue_range_in_radians.IsValid())
      break;
    this->m_is_set = 1;
    return true;
  }
  this->m_is_set = 0;
  return false;
}